

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O0

TestCaseGroup * vkt::SpirVAssembly::createSConvertTests(TestContext *testCtx)

{
  undefined8 testCtx_00;
  bool bVar1;
  TestCaseGroup *pTVar2;
  reference convertCase;
  pointer pCVar3;
  TestNode *this;
  SpvAsmComputeShaderCase *this_00;
  char *name;
  pointer local_184;
  int local_17c;
  string local_178;
  undefined1 local_158 [8];
  ComputeShaderSpec spec;
  __normal_iterator<vkt::SpirVAssembly::ConvertCase_*,_std::vector<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>_>
  local_88;
  __normal_iterator<const_vkt::SpirVAssembly::ConvertCase_*,_std::vector<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>_>
  local_80;
  const_iterator test;
  vector<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>
  testCases;
  undefined1 local_58 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string instruction;
  TestContext *testCtx_local;
  
  instruction.field_2._8_8_ = testCtx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_30,"OpSConvert",&local_31);
  std::allocator<char>::~allocator(&local_31);
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar2,(TestContext *)instruction.field_2._8_8_,"sconvert","OpSConvert");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)
             ((long)&testCases.
                     super__Vector_base<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_58,pTVar2
            );
  std::vector<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>::
  vector((vector<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>
          *)&test);
  createSConvertCases((vector<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>
                       *)&test);
  local_88._M_current =
       (ConvertCase *)
       std::
       vector<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>::
       begin((vector<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>
              *)&test);
  __gnu_cxx::
  __normal_iterator<vkt::SpirVAssembly::ConvertCase_const*,std::vector<vkt::SpirVAssembly::ConvertCase,std::allocator<vkt::SpirVAssembly::ConvertCase>>>
  ::__normal_iterator<vkt::SpirVAssembly::ConvertCase*>
            ((__normal_iterator<vkt::SpirVAssembly::ConvertCase_const*,std::vector<vkt::SpirVAssembly::ConvertCase,std::allocator<vkt::SpirVAssembly::ConvertCase>>>
              *)&local_80,&local_88);
  while( true ) {
    spec.verifyIO =
         (_func_bool_vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>_ptr_vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>_ptr_vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>_ptr_TestLog_ptr
          *)std::
            vector<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>
            ::end((vector<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>
                   *)&test);
    bVar1 = __gnu_cxx::operator!=
                      (&local_80,
                       (__normal_iterator<vkt::SpirVAssembly::ConvertCase_*,_std::vector<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>_>
                        *)&spec.verifyIO);
    if (!bVar1) break;
    ComputeShaderSpec::ComputeShaderSpec((ComputeShaderSpec *)local_158);
    convertCase = __gnu_cxx::
                  __normal_iterator<const_vkt::SpirVAssembly::ConvertCase_*,_std::vector<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>_>
                  ::operator*(&local_80);
    getConvertCaseShaderStr(&local_178,(string *)local_30,convertCase);
    std::__cxx11::string::operator=((string *)local_158,(string *)&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    pCVar3 = __gnu_cxx::
             __normal_iterator<const_vkt::SpirVAssembly::ConvertCase_*,_std::vector<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>_>
             ::operator->(&local_80);
    std::
    vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
    ::push_back((vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                 *)((long)&spec.entryPoint.field_2 + 8),&pCVar3->m_inputBuffer);
    pCVar3 = __gnu_cxx::
             __normal_iterator<const_vkt::SpirVAssembly::ConvertCase_*,_std::vector<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>_>
             ::operator->(&local_80);
    std::
    vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
    ::push_back((vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                 *)&spec.inputs.
                    super__Vector_base<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&pCVar3->m_outputBuffer);
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&local_184,1,1,1);
    spec.numWorkGroups.m_data[0] = local_17c;
    spec.outputs.
    super__Vector_base<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = local_184;
    this = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_58)->super_TestNode;
    this_00 = (SpvAsmComputeShaderCase *)operator_new(0x140);
    testCtx_00 = instruction.field_2._8_8_;
    __gnu_cxx::
    __normal_iterator<const_vkt::SpirVAssembly::ConvertCase_*,_std::vector<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>_>
    ::operator->(&local_80);
    name = (char *)std::__cxx11::string::c_str();
    pCVar3 = __gnu_cxx::
             __normal_iterator<const_vkt::SpirVAssembly::ConvertCase_*,_std::vector<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>_>
             ::operator->(&local_80);
    SpvAsmComputeShaderCase::SpvAsmComputeShaderCase
              (this_00,(TestContext *)testCtx_00,name,"Convert integers with OpSConvert.",
               (ComputeShaderSpec *)local_158,pCVar3->m_features);
    tcu::TestNode::addChild(this,(TestNode *)this_00);
    ComputeShaderSpec::~ComputeShaderSpec((ComputeShaderSpec *)local_158);
    __gnu_cxx::
    __normal_iterator<const_vkt::SpirVAssembly::ConvertCase_*,_std::vector<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>_>
    ::operator++(&local_80);
  }
  pTVar2 = de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
           release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_58)
  ;
  std::vector<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>::
  ~vector((vector<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>
           *)&test);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_58);
  std::__cxx11::string::~string((string *)local_30);
  return pTVar2;
}

Assistant:

tcu::TestCaseGroup* createSConvertTests (tcu::TestContext& testCtx)
{
	const string instruction				("OpSConvert");
	de::MovePtr<tcu::TestCaseGroup>	group	(new tcu::TestCaseGroup(testCtx, "sconvert", "OpSConvert"));
	vector<ConvertCase>				testCases;
	createSConvertCases(testCases);

	for (vector<ConvertCase>::const_iterator test = testCases.begin(); test != testCases.end(); ++test)
	{
		ComputeShaderSpec	spec;

		spec.assembly = getConvertCaseShaderStr(instruction, *test);
		spec.inputs.push_back(test->m_inputBuffer);
		spec.outputs.push_back(test->m_outputBuffer);
		spec.numWorkGroups = IVec3(1, 1, 1);

		group->addChild(new SpvAsmComputeShaderCase(testCtx, test->m_name.c_str(), "Convert integers with OpSConvert.", spec, test->m_features));
	}

	return group.release();
}